

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O1

void duckdb::SerializeDecimalArithmetic
               (Serializer *serializer,optional_ptr<duckdb::FunctionData,_true> bind_data_p,
               ScalarFunction *function)

{
  optional_ptr<duckdb::FunctionData,_true> oVar1;
  optional_ptr<duckdb::FunctionData,_true> local_20;
  
  local_20.ptr = bind_data_p.ptr;
  optional_ptr<duckdb::FunctionData,_true>::CheckValid(&local_20);
  oVar1 = local_20;
  (*serializer->_vptr_Serializer[2])(serializer,100,"check_overflow");
  (*serializer->_vptr_Serializer[0xe])(serializer,(ulong)*(byte *)&oVar1.ptr[1]._vptr_FunctionData);
  (*serializer->_vptr_Serializer[3])(serializer);
  Serializer::WriteProperty<duckdb::LogicalType>
            (serializer,0x65,"return_type",&(function->super_BaseScalarFunction).return_type);
  (*serializer->_vptr_Serializer[2])(serializer,0x66,"arguments");
  Serializer::WriteValue<duckdb::LogicalType>
            (serializer,&(function->super_BaseScalarFunction).super_SimpleFunction.arguments);
  (*serializer->_vptr_Serializer[3])(serializer);
  return;
}

Assistant:

static void SerializeDecimalArithmetic(Serializer &serializer, const optional_ptr<FunctionData> bind_data_p,
                                       const ScalarFunction &function) {
	auto &bind_data = bind_data_p->Cast<DecimalArithmeticBindData>();
	serializer.WriteProperty(100, "check_overflow", bind_data.check_overflow);
	serializer.WriteProperty(101, "return_type", function.return_type);
	serializer.WriteProperty(102, "arguments", function.arguments);
}